

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_reader(reader *r)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  int local_1c;
  int n;
  int c;
  int sum;
  reader *r_local;
  
  n = (*r->_vptr_reader[2])();
  poVar2 = std::operator<<((ostream *)jlog,"FIRST CHAR : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,n);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_1c = 1;
  while( true ) {
    iVar1 = (*r->_vptr_reader[2])();
    if (iVar1 == -1) break;
    n = (uint)(iVar1 != -1) + n;
    local_1c = local_1c + 1;
  }
  poVar2 = std::operator<<((ostream *)jlog,"LENGTH : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_1c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)jlog,"SUM    : ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,n);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void test_reader(reader &r)
{
    int sum = 0;
    int c = r.next();
    sum += c;
    jlog << "FIRST CHAR : " << c << endl;
    int n = 1;
    while ((c = r.next() != EOF))
    {
        sum += c;
        n++;
    }
    jlog << "LENGTH : " << n << endl;
    jlog << "SUM    : " << sum << endl;
}